

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
::erase(btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
        *this,iterator iter)

{
  size_type *psVar1;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar2;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar3;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar4;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
  this_00;
  int to_move;
  uint to_move_00;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  undefined8 extraout_RAX;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar8;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar9;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
  _Var10;
  uint uVar11;
  char *__function;
  int iVar12;
  allocator_type *paVar13;
  uint uVar14;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar15;
  iterator iVar16;
  iterator iVar17;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_58;
  uint local_44;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_40;
  
  paVar13 = iter._8_8_;
  pbVar15 = iter.node;
  uVar14 = iter.position;
  local_40.node = pbVar15;
  local_40.position = uVar14;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    bVar2 = pbVar15[0xb];
    if (bVar2 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                  )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
      ::operator--(&local_40);
      if (((ulong)local_40.node & 7) != 0) goto LAB_001cd45e;
      if (local_40.node[0xb] ==
          (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
           )0x0) {
        __assert_fail("iter.node->leaf()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xa7e,
                      "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::erase(iterator) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                     );
      }
      paVar13 = (allocator_type *)(long)(int)uVar14;
      *(undefined4 *)(pbVar15 + (long)paVar13 * 4 + 0xc) =
           *(undefined4 *)(local_40.node + (long)local_40.position * 4 + 0xc);
    }
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
    ::remove_value(local_40.node,local_40.position,paVar13);
    psVar1 = &(this->tree_).size_;
    *psVar1 = *psVar1 - 1;
    local_58.node = local_40.node;
    local_58.position = local_40.position;
    local_44 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    uVar14 = local_40.position;
    for (pbVar15 = local_40.node;
        _Var10._M_head_impl =
             (this->tree_).root_.
             super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
             ._M_head_impl, pbVar15 != _Var10._M_head_impl;
        pbVar15 = *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    **)pbVar15) {
      if (((ulong)pbVar15 & 7) != 0) goto LAB_001cd45e;
      if (0x1d < (byte)pbVar15[10]) goto LAB_001cd3f2;
      pbVar9 = *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                 **)pbVar15;
      if ((ulong)(byte)pbVar15[8] == 0) {
LAB_001cd1df:
        if (((ulong)pbVar9 & 7) != 0) goto LAB_001cd45e;
        bVar7 = true;
        if ((byte)pbVar15[8] < (byte)pbVar9[10]) {
          pbVar8 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                   ::child(pbVar9,(ulong)(byte)pbVar15[8] + 1);
          if (((ulong)pbVar8 & 7) != 0) goto LAB_001cd45e;
          if ((pbVar8[0xb] !=
               (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                )0x0) &&
             (pbVar8[0xb] !=
              (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               )0x3d)) {
            __assert_fail("right->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xbd0,
                          "bool phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                         );
          }
          bVar3 = pbVar15[10];
          bVar4 = pbVar8[10];
          if ((uint)(byte)bVar3 + (uint)(byte)bVar4 + 1 < 0x3e) {
            btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::merge_nodes(&this->tree_,pbVar15,pbVar8);
            bVar7 = true;
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if ((byte)bVar4 < 0x1f) {
              bVar7 = true;
            }
            else if ((bVar3 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                                )0x0) || (bVar7 = true, 0 < (int)uVar14)) {
              iVar12 = (int)((uint)(byte)bVar4 - (uint)(byte)bVar3) / 2;
              to_move = (byte)bVar4 - 1;
              if (iVar12 <= (int)((byte)bVar4 - 1)) {
                to_move = iVar12;
              }
              btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::rebalance_right_to_left
                        (pbVar15,to_move,pbVar8,
                         (allocator_type *)(ulong)((uint)(byte)bVar4 - (uint)(byte)bVar3));
              bVar5 = false;
              bVar7 = false;
            }
          }
          if (!bVar5) goto LAB_001cd31e;
        }
        if ((ulong)(byte)pbVar15[8] == 0) {
          bVar7 = false;
        }
        else {
          pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                   ::child(pbVar9,(ulong)(byte)pbVar15[8] - 1);
          if (((ulong)pbVar9 & 7) != 0) goto LAB_001cd45e;
          bVar3 = pbVar9[10];
          if (((byte)bVar3 < 0x1f) ||
             ((bVar4 = pbVar15[10],
              bVar4 != (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                        )0x0 && ((int)(uint)(byte)bVar4 <= (int)uVar14)))) {
            bVar6 = 0;
          }
          else {
            uVar11 = (int)((uint)(byte)bVar3 - (uint)(byte)bVar4) / 2;
            to_move_00 = (byte)bVar3 - 1;
            if ((int)uVar11 <= (int)((byte)bVar3 - 1)) {
              to_move_00 = uVar11;
            }
            btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::rebalance_left_to_right(pbVar9,to_move_00,pbVar15,(allocator_type *)(ulong)uVar11);
            uVar14 = uVar14 + to_move_00;
            bVar6 = 1;
            bVar7 = false;
          }
          bVar7 = (bool)(bVar7 & bVar6);
        }
      }
      else {
        pbVar8 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                 ::child(pbVar9,(ulong)(byte)pbVar15[8] - 1);
        if (((ulong)pbVar8 & 7) != 0) goto LAB_001cd45e;
        if ((pbVar8[0xb] !=
             (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              )0x0) &&
           (pbVar8[0xb] !=
            (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
             )0x3d)) {
          __assert_fail("left->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xbc5,
                        "bool phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                       );
        }
        if (0x3d < (uint)(byte)pbVar15[10] + (uint)(byte)pbVar8[10] + 1) goto LAB_001cd1df;
        uVar14 = (byte)pbVar8[10] + 1 + uVar14;
        btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
        ::merge_nodes(&this->tree_,pbVar8,pbVar15);
        bVar7 = true;
        pbVar15 = pbVar8;
      }
LAB_001cd31e:
      if ((local_44 & 1) != 0) {
        local_44 = 0;
        local_58.node = pbVar15;
        local_58.position = uVar14;
      }
      if (!bVar7) goto LAB_001cd3f2;
      uVar14 = (uint)(byte)pbVar15[8];
    }
    if (((ulong)_Var10._M_head_impl & 7) == 0) {
      if (_Var10._M_head_impl[10] ==
          (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
           )0x0) {
        if (_Var10._M_head_impl[0xb] ==
            (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
             )0x0) {
          paVar13 = (allocator_type *)0x0;
          _Var10._M_head_impl =
               btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               ::child(_Var10._M_head_impl,0);
          if (((ulong)_Var10._M_head_impl & 7) == 0) {
            bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::is_root(*_Var10._M_head_impl);
            if (!bVar7) {
              __assert_fail("parent()->is_root()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x4ad,
                            "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::make_root() [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                           );
            }
            if (((ulong)*(undefined8 **)_Var10._M_head_impl & 7) == 0) {
              *(undefined8 *)_Var10._M_head_impl = **(undefined8 **)_Var10._M_head_impl;
              this_00._M_head_impl =
                   (this->tree_).root_.
                   super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                   .
                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
                   ._M_head_impl;
              btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::destroy(this_00._M_head_impl,paVar13);
              operator_delete(this_00._M_head_impl,0x2f0);
              (this->tree_).root_.
              super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
              ._M_head_impl = _Var10._M_head_impl;
              goto LAB_001cd3eb;
            }
          }
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_001cd473;
        }
        if ((this->tree_).size_ != 0) {
          __assert_fail("size() == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xbfc,
                        "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_shrink() [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                       );
        }
        btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
        ::delete_leaf_node(&this->tree_,_Var10._M_head_impl);
        (this->tree_).root_.
        super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              *)btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
                ::EmptyNode()::empty_node;
        (this->tree_).rightmost_ =
             (node_type *)
             btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
             ::EmptyNode()::empty_node;
      }
LAB_001cd3eb:
      if ((this->tree_).size_ == 0) {
        iVar17 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                 ::end(&this->tree_);
        local_58.position = iVar17.position;
        local_58.node = iVar17.node;
LAB_001cd421:
        if (bVar2 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                      )0x0) {
          btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
          ::operator++(&local_58);
        }
        iVar16.position = local_58.position;
        iVar16.node = local_58.node;
        iVar16._12_4_ = 0;
        return iVar16;
      }
LAB_001cd3f2:
      if (((ulong)local_58.node & 7) == 0) {
        if (local_58.position == (uint)(byte)local_58.node[10]) {
          local_58.position = (byte)local_58.node[10] - 1;
          btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
          ::operator++(&local_58);
        }
        goto LAB_001cd421;
      }
    }
  }
LAB_001cd45e:
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_001cd473:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

iterator erase(iterator iter)       { return tree_.erase(iter); }